

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::init
          (TextureSizeCase *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *this_00;
  Context *pCVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  ShaderProgram *this_01;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  ContextType CVar9;
  GLSLVersion GVar10;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  char *pcVar12;
  mapped_type *pmVar13;
  pointer pcVar14;
  reference pvVar15;
  NotSupportedError *this_02;
  TestError *this_03;
  long lVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  TextureSizeCase *ctx_00;
  int ndx;
  long lVar19;
  size_type __dnew;
  GLint maxTextureSize;
  GLint maxTextureLayers;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializationMap;
  GLint maxSamples;
  size_type __dnew_1;
  size_type __dnew_5;
  string local_2e0;
  int local_2c0;
  int local_2bc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  int local_284;
  string local_280;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  ShaderProgram *local_238;
  long local_230;
  RenderContext *local_228;
  size_type local_220;
  uint local_218;
  value_type local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  ctx_00 = this;
  if ((anonymous_namespace)::TextureSizeCase::init()::testSizes2D == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)this);
  }
  if ((anonymous_namespace)::TextureSizeCase::init()::testSizes3D == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)ctx_00);
  }
  if ((anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)ctx_00);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar8);
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(CVar9,(ApiType)0x23);
  if (((!bVar7) && (this->m_isArrayType != false)) &&
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array"), !bVar7)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Test requires OES_texture_storage_multisample_2d_array extension",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xa7);
LAB_00486956:
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar11->m_width < 1) ||
     (pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context), pRVar11->m_height < 1))
  {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"rendertarget size must be at least 1x1",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xaa);
    goto LAB_00486956;
  }
  local_2c0 = 0;
  local_2bc = 0;
  local_284 = 0;
  (**(code **)(lVar19 + 0x868))(0xd33);
  (**(code **)(lVar19 + 0x868))(0x88ff,&local_2bc);
  uVar18 = 0x8058;
  uVar17 = 0x9102;
  switch(this->m_type) {
  default:
    uVar17 = 0x9100;
    switch(this->m_type) {
    case TEXTURE_FLOAT_2D:
    case TEXTURE_FLOAT_2D_ARRAY:
      break;
    case TEXTURE_INT_2D:
    case TEXTURE_INT_2D_ARRAY:
      uVar18 = 0x8231;
      break;
    case TEXTURE_UINT_2D:
      uVar18 = 0x8232;
      break;
    default:
      uVar18 = 0;
    }
    break;
  case TEXTURE_FLOAT_2D_ARRAY:
    break;
  case TEXTURE_INT_2D_ARRAY:
    uVar18 = 0x8231;
    break;
  case TEXTURE_UINT_2D_ARRAY:
    uVar18 = 0x8232;
  }
  (**(code **)(lVar19 + 0x880))(uVar17,uVar18,0x80a9,1,&local_284);
  if (local_284 < this->m_numSamples) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"sample count is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xb5);
    goto LAB_00486956;
  }
  local_238 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  local_228 = pCVar3->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  CVar9.super_ApiType.m_bits = (ApiType)(*pCVar3->m_renderCtx->_vptr_RenderContext[2])();
  GVar10 = glu::getContextTypeGLSLVersion(CVar9);
  p_Var1 = &local_2b8._M_impl.super__Rb_tree_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pcVar12 = glu::getGLSLVersionDeclaration(GVar10);
  local_2e0._M_dataplus._M_p = (pointer)0x11;
  local_260._0_8_ = &local_250;
  local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_2e0);
  local_250._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  *(undefined8 *)local_260._0_8_ = 0x5245565f4c534c47;
  *(char *)(local_260._0_8_ + 8) = 'S';
  *(char *)(local_260._0_8_ + 9) = 'I';
  *(char *)(local_260._0_8_ + 10) = 'O';
  *(char *)(local_260._0_8_ + 0xb) = 'N';
  *(char *)(local_260._0_8_ + 0xc) = '_';
  *(char *)(local_260._0_8_ + 0xd) = 'D';
  *(char *)(local_260._0_8_ + 0xe) = 'E';
  *(char *)(local_260._0_8_ + 0xf) = 'C';
  *(char *)(local_260._0_8_ + 0x10) = 'L';
  local_260._8_8_ = local_2e0._M_dataplus._M_p;
  *(char *)(local_260._0_8_ + (long)local_2e0._M_dataplus._M_p) = '\0';
  local_230 = lVar19;
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b8,(key_type *)local_260);
  pcVar4 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar4,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
  }
  paVar2 = &local_2e0.field_2;
  local_280._M_dataplus._M_p = (pointer)0x5f;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
  _Var5._M_p = local_280._M_dataplus._M_p;
  local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
  local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
  local_2e0._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5f);
  local_2e0._M_string_length = (size_type)_Var5._M_p;
  pcVar14[_Var5._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_260,&local_2e0);
  tcu::StringTemplate::specialize
            (&local_1d0,(StringTemplate *)local_260,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  local_218 = 0;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_218 * 0x18),&local_210);
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  switch(this->m_type) {
  case TEXTURE_FLOAT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cf86);
    break;
  case TEXTURE_FLOAT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cf93);
    break;
  case TEXTURE_INT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cf85);
    break;
  case TEXTURE_INT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cf92);
    break;
  case TEXTURE_UINT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cfa4);
    break;
  case TEXTURE_UINT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cfb1);
    break;
  default:
    goto switchD_00486009_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
switchD_00486009_default:
  if (this->m_isArrayType == false) {
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x505954455a4953;
    local_2e0.field_2._M_local_buf[7] = 'E';
    local_2e0._M_string_length = 8;
    local_2e0.field_2._M_local_buf[8] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x9a4673);
  }
  else {
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x505954455a4953;
    local_2e0.field_2._M_local_buf[7] = 'E';
    local_2e0._M_string_length = 8;
    local_2e0.field_2._M_local_buf[8] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96cfc3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(CVar9,(ApiType)0x23);
  if (bVar7 || this->m_isArrayType != true) {
    local_280._M_dataplus._M_p = (pointer)0x13;
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    local_2e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
    local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
    local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_2e0._M_dataplus._M_p,"EXTENSION_STATEMENT",0x13);
    local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x96985f);
  }
  else {
    local_280._M_dataplus._M_p = (pointer)0x13;
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    local_2e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
    local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
    local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_2e0._M_dataplus._M_p,"EXTENSION_STATEMENT",0x13);
    local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x947de2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  GVar10 = glu::getContextTypeGLSLVersion(CVar9);
  pcVar12 = glu::getGLSLVersionDeclaration(GVar10);
  local_280._M_dataplus._M_p = (pointer)0x11;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  local_2e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
  local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
  local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_2e0._M_dataplus._M_p,"GLSL_VERSION_DECL",0x11);
  local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
  local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b8,&local_2e0);
  pcVar4 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar4,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_220 = 0x172;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_220);
  sVar6 = local_220;
  local_280.field_2._M_allocated_capacity = local_220;
  local_280._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${GLSL_VERSION_DECL}\n${EXTENSION_STATEMENT}layout(location = 0) out highp vec4 fragColor;\nuniform highp ${SAMPLERTYPE} u_sampler;\nuniform highp ${SIZETYPE} u_size;\nvoid main (void)\n{\n\tconst highp vec4 okColor = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 failColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tfragColor = (textureSize(u_sampler) == u_size) ? (okColor) : (failColor);\n}\n"
         ,0x172);
  local_280._M_string_length = sVar6;
  pcVar14[sVar6] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2e0,&local_280);
  tcu::StringTemplate::specialize
            (&local_1f0,(StringTemplate *)&local_2e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b8);
  lVar19 = local_230;
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  local_260._0_4_ = 1;
  local_260._8_8_ = local_250._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_260 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  this_01 = local_238;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_260._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_260 + 8));
  glu::ShaderProgram::ShaderProgram(this_01,local_228,(ProgramSources *)local_1b0);
  this->m_shader = this_01;
  if ((char *)local_260._8_8_ != local_250._M_local_buf + 8) {
    operator_delete((void *)local_260._8_8_,local_250._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar16 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_shader);
  if ((this->m_shader->m_program).m_info.linkOk != false) {
    (**(code **)(lVar19 + 0x6c8))(1,&this->m_vbo);
    (**(code **)(lVar19 + 0x40))(0x8892,this->m_vbo);
    (**(code **)(lVar19 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"GL_MAX_TEXTURE_SIZE = ",0x16);
    std::ostream::operator<<(this_00,local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"GL_MAX_ARRAY_TEXTURE_LAYERS = ",0x1e);
    std::ostream::operator<<(this_00,local_2bc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    if (this->m_isArrayType == false) {
      lVar19 = 0;
      do {
        local_1b0._0_4_ = init::testSizes2D[lVar19].m_data[0];
        if (((int)local_1b0._0_4_ <= local_2c0) &&
           (local_1b0._4_4_ = init::testSizes2D[lVar19].m_data[1], (int)local_1b0._4_4_ <= local_2c0
           )) {
          if ((int)local_1b0._0_4_ < 0) {
            local_1b0._0_4_ = local_2c0;
          }
          if ((int)local_1b0._4_4_ < 0) {
            local_1b0._4_4_ = local_2c0;
          }
          local_1b0._8_4_ = 0;
          pvVar15 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                    emplace_back<tcu::Vector<int,3>>
                              ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                               &this->m_iterations,(Vector<int,_3> *)local_1b0);
          local_1b0._0_4_ = SUB84(pvVar15,0);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 7);
    }
    else {
      lVar19 = 8;
      do {
        local_1b0._0_4_ =
             *(undefined4 *)(&(anonymous_namespace)::TextureSizeCase::init()::testSizes2D + lVar19);
        if ((((int)local_1b0._0_4_ <= local_2c0) &&
            (local_1b0._4_4_ = *(int *)(lVar19 + 0xb54c0c), (int)local_1b0._4_4_ <= local_2c0)) &&
           (iVar8 = *(int *)((long)init::testSizes3D[0].m_data + lVar19), iVar8 <= local_2bc)) {
          if ((int)local_1b0._0_4_ < 0) {
            local_1b0._0_4_ = local_2c0;
          }
          if ((int)local_1b0._4_4_ < 0) {
            local_1b0._4_4_ = local_2c0;
          }
          local_1b0._8_4_ = local_2bc;
          if (-1 < iVar8) {
            local_1b0._8_4_ = iVar8;
          }
          pvVar15 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                    emplace_back<tcu::Vector<int,3>>
                              ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                               &this->m_iterations,(Vector<int,_3> *)local_1b0);
          local_1b0._0_4_ = SUB84(pvVar15,0);
        }
        lVar19 = lVar19 + 0xc;
      } while (lVar19 != 0x68);
    }
    return local_1b0._0_4_;
  }
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader build failed","");
  tcu::TestError::TestError(this_03,(string *)local_1b0);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureSizeCase::init (void)
{
	static const tcu::IVec2 testSizes2D[] =
	{
		tcu::IVec2(1,	1),
		tcu::IVec2(1,	4),
		tcu::IVec2(4,	8),
		tcu::IVec2(21,	11),
		tcu::IVec2(107,	254),
		tcu::IVec2(-1,	3),
		tcu::IVec2(3,	-1),
	};
	static const tcu::IVec3 testSizes3D[] =
	{
		tcu::IVec3(1,	1,		1),
		tcu::IVec3(1,	4,		7),
		tcu::IVec3(4,	8,		12),
		tcu::IVec3(21,	11,		9),
		tcu::IVec3(107,	254,	2),
		tcu::IVec3(-1,	3,		3),
		tcu::IVec3(3,	-1,		3),
		tcu::IVec3(4,	4,		-1),
	};
	static const tcu::Vec4 fullscreenQuad[] =
	{
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f)
	};

	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension");

	if (m_context.getRenderTarget().getWidth() < 1 || m_context.getRenderTarget().getHeight() < 1)
		TCU_THROW(NotSupportedError, "rendertarget size must be at least 1x1");

	glw::GLint				maxTextureSize		= 0;
	glw::GLint				maxTextureLayers	= 0;
	glw::GLint				maxSamples			= 0;

	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);
	gl.getInternalformativ(getTextureGLTarget(), getTextureGLInternalFormat(), GL_SAMPLES, 1, &maxSamples);

	if (m_numSamples > maxSamples)
		TCU_THROW(NotSupportedError, "sample count is not supported");

	// gen shade

	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, s_positionVertexShaderSource)) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_shader;
	if (!m_shader->isOk())
		throw tcu::TestError("shader build failed");

	// gen buffer

	gl.genBuffers(1, &m_vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);

	// gen iterations

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_MAX_TEXTURE_SIZE = " << maxTextureSize << "\n"
		<< "GL_MAX_ARRAY_TEXTURE_LAYERS = " << maxTextureLayers
		<< tcu::TestLog::EndMessage;

	if (!m_isArrayType)
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes2D); ++ndx)
		{
			if (testSizes2D[ndx].x() <= maxTextureSize && testSizes2D[ndx].y() <= maxTextureSize)
			{
				const int w = (testSizes2D[ndx].x() < 0) ? (maxTextureSize) : (testSizes2D[ndx].x());
				const int h = (testSizes2D[ndx].y() < 0) ? (maxTextureSize) : (testSizes2D[ndx].y());

				m_iterations.push_back(tcu::IVec3(w, h, 0));
			}
		}
	}
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes3D); ++ndx)
		{
			if (testSizes3D[ndx].x() <= maxTextureSize && testSizes3D[ndx].y() <= maxTextureSize && testSizes3D[ndx].z() <= maxTextureLayers)
			{
				const int w = (testSizes3D[ndx].x() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].x());
				const int h = (testSizes3D[ndx].y() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].y());
				const int d = (testSizes3D[ndx].z() < 0) ? (maxTextureLayers)	: (testSizes3D[ndx].z());

				m_iterations.push_back(tcu::IVec3(w, h, d));
			}
		}
	}
}